

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall RtMidiIn::RtMidiIn(RtMidiIn *this,Api api,string *clientName,uint queueSizeLimit)

{
  MidiApi *pMVar1;
  pointer pAVar2;
  int iVar3;
  RtMidiError *this_00;
  long lVar4;
  ulong uVar5;
  string errorText;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  string local_68;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> local_48;
  
  (this->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  (this->super_RtMidi)._vptr_RtMidi = (_func_int **)&PTR_openPort_001159d8;
  if (api != UNSPECIFIED) {
    openMidiApi(this,api,clientName,queueSizeLimit);
    if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nRtMidiIn: no compiled support for specified API argument!\n\n",0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi(&local_48);
  pAVar2 = local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      openMidiApi(this,pAVar2[uVar5],clientName,queueSizeLimit);
      pMVar1 = (this->super_RtMidi).rtapi_;
      if ((pMVar1 != (MidiApi *)0x0) && (iVar3 = (*pMVar1->_vptr_MidiApi[8])(), iVar3 != 0)) break;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < (ulong)(lVar4 >> 2));
  }
  if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
    if (pAVar2 != (pointer)0x0) {
      operator_delete(pAVar2,(long)local_48.
                                   super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar2)
      ;
    }
    return;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"RtMidiIn: no compiled API support found ... critical error!!","");
  this_00 = (RtMidiError *)__cxa_allocate_exception(0x30);
  RtMidiError::RtMidiError(this_00,&local_68,UNSPECIFIED);
  __cxa_throw(this_00,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
}

Assistant:

RTMIDI_DLL_PUBLIC RtMidiIn :: RtMidiIn( RtMidi::Api api, const std::string &clientName, unsigned int queueSizeLimit )
  : RtMidi()
{
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openMidiApi( api, clientName, queueSizeLimit );
    if ( rtapi_ ) return;

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    std::cerr << "\nRtMidiIn: no compiled support for specified API argument!\n\n" << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one port or we reach the end of the list.
  std::vector< RtMidi::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openMidiApi( apis[i], clientName, queueSizeLimit );
    if ( rtapi_ && rtapi_->getPortCount() ) break;
  }

  if ( rtapi_ ) return;

  // It should not be possible to get here because the preprocessor
  // definition __RTMIDI_DUMMY__ is automatically defined if no
  // API-specific definitions are passed to the compiler. But just in
  // case something weird happens, we'll throw an error.
  std::string errorText = "RtMidiIn: no compiled API support found ... critical error!!";
  throw( RtMidiError( errorText, RtMidiError::UNSPECIFIED ) );
}